

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O0

rect<int> __thiscall
irr::gui::CGUISkin::draw3DWindowBackground
          (CGUISkin *this,IGUIElement *element,bool drawTitleBar,SColor titleBarColor,rect<int> *r,
          rect<int> *clip,rect<int> *checkClientArea)

{
  rect<int> rVar1;
  int iVar2;
  int iVar3;
  u32 uVar4;
  u32 in_ECX;
  byte in_DL;
  SColor *in_RDI;
  int *in_R8;
  undefined8 in_R9;
  undefined8 *in_stack_00000008;
  SColor c_1;
  SColor c;
  SColor c1_1;
  SColor c2_1;
  SColor c2;
  SColor c1;
  rect<int> rect;
  undefined8 in_stack_ffffffffffffff18;
  long *plVar5;
  f32 d;
  SColor *in_stack_ffffffffffffff20;
  SColor local_bc;
  u32 local_b8;
  u32 local_b4;
  u32 local_b0;
  u32 local_ac;
  u32 local_a8;
  SColor local_a4;
  u32 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  u32 local_84;
  u32 local_80;
  u32 local_7c;
  u32 local_78;
  SColor local_74;
  undefined4 local_70;
  u32 local_6c;
  SColor local_68;
  undefined4 local_64;
  u32 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined8 local_40;
  int *local_38;
  byte local_29;
  SColor local_14;
  int local_10;
  int iStack_c;
  int local_8;
  int iStack_4;
  
  d = (f32)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_29 = in_DL & 1;
  if (*(long *)(in_RDI + 0x96) == 0) {
    if (in_stack_00000008 != (undefined8 *)0x0) {
      *in_stack_00000008 = *(undefined8 *)in_R8;
      in_stack_00000008[1] = *(undefined8 *)(in_R8 + 2);
    }
    local_10 = (int)*(undefined8 *)in_R8;
    iStack_c = (int)((ulong)*(undefined8 *)in_R8 >> 0x20);
    local_8 = (int)*(undefined8 *)(in_R8 + 2);
    iStack_4 = (int)((ulong)*(undefined8 *)(in_R8 + 2) >> 0x20);
  }
  else {
    local_10 = (int)*(undefined8 *)in_R8;
    iStack_c = (int)((ulong)*(undefined8 *)in_R8 >> 0x20);
    local_8 = (int)*(undefined8 *)(in_R8 + 2);
    iStack_4 = iStack_c + 1;
    local_40 = in_R9;
    local_38 = in_R8;
    local_14.color = in_ECX;
    if (in_stack_00000008 == (undefined8 *)0x0) {
      in_stack_ffffffffffffff20 = *(SColor **)(in_RDI + 0x96);
      local_44 = (*(code *)**(undefined8 **)in_RDI)(in_RDI,3,0);
      (**(code **)(*(long *)in_stack_ffffffffffffff20 + 0x198))
                (in_stack_ffffffffffffff20,local_44,&local_10,local_40);
    }
    iStack_4 = local_38[3];
    local_8 = local_10 + 1;
    if (in_stack_00000008 == (undefined8 *)0x0) {
      plVar5 = *(long **)(in_RDI + 0x96);
      local_48 = (*(code *)**(undefined8 **)in_RDI)(in_RDI,3);
      (**(code **)(*plVar5 + 0x198))(plVar5,local_48,&local_10,local_40);
      d = (f32)((ulong)plVar5 >> 0x20);
    }
    local_10 = local_38[2] + -1;
    local_8 = local_38[2];
    iStack_c = local_38[1];
    iStack_4 = local_38[3];
    if (in_stack_00000008 == (undefined8 *)0x0) {
      plVar5 = *(long **)(in_RDI + 0x96);
      local_4c = (*(code *)**(undefined8 **)in_RDI)(in_RDI,0);
      (**(code **)(*plVar5 + 0x198))(plVar5,local_4c,&local_10,local_40);
    }
    local_10 = local_10 + -1;
    local_8 = local_8 + -1;
    iStack_c = iStack_c + 1;
    iStack_4 = iStack_4 + -1;
    if (in_stack_00000008 == (undefined8 *)0x0) {
      plVar5 = *(long **)(in_RDI + 0x96);
      local_50 = (*(code *)**(undefined8 **)in_RDI)(in_RDI,1);
      (**(code **)(*plVar5 + 0x198))(plVar5,local_50,&local_10,local_40);
    }
    local_10 = *local_38;
    iStack_c = local_38[3] + -1;
    iStack_4 = local_38[3];
    local_8 = local_38[2];
    if (in_stack_00000008 == (undefined8 *)0x0) {
      plVar5 = *(long **)(in_RDI + 0x96);
      local_54 = (*(code *)**(undefined8 **)in_RDI)(in_RDI,0);
      (**(code **)(*plVar5 + 0x198))(plVar5,local_54,&local_10,local_40);
    }
    local_10 = local_10 + 1;
    local_8 = local_8 + -1;
    iStack_c = iStack_c + -1;
    iStack_4 = iStack_4 + -1;
    if (in_stack_00000008 == (undefined8 *)0x0) {
      plVar5 = *(long **)(in_RDI + 0x96);
      local_58 = (*(code *)**(undefined8 **)in_RDI)(in_RDI,1);
      (**(code **)(*plVar5 + 0x198))(plVar5,local_58,&local_10,local_40);
    }
    local_10 = (int)*(undefined8 *)local_38;
    iStack_c = (int)((ulong)*(undefined8 *)local_38 >> 0x20);
    local_8 = (int)*(undefined8 *)(local_38 + 2);
    iStack_4 = (int)((ulong)*(undefined8 *)(local_38 + 2) >> 0x20);
    local_10 = local_10 + 1;
    iStack_c = iStack_c + 1;
    local_8 = local_8 + -2;
    iStack_4 = iStack_4 + -2;
    if (in_stack_00000008 == (undefined8 *)0x0) {
      if ((in_RDI[0x98].color & 1) == 0) {
        plVar5 = *(long **)(in_RDI + 0x96);
        local_5c = (*(code *)**(undefined8 **)in_RDI)(in_RDI,2);
        (**(code **)(*plVar5 + 0x198))(plVar5,local_5c,&local_10,local_40);
      }
      else if (in_RDI[0x99].color == 2) {
        local_64 = (*(code *)**(undefined8 **)in_RDI)(in_RDI,0x11);
        video::SColor::SColor(&local_68,0xffffffff);
        local_60 = (u32)video::SColor::getInterpolated(in_RDI,in_stack_ffffffffffffff20,d);
        local_70 = (*(code *)**(undefined8 **)in_RDI)(in_RDI,0x11);
        video::SColor::SColor(&local_74,0xffffffff);
        local_84 = (u32)video::SColor::getInterpolated(in_RDI,in_stack_ffffffffffffff20,d);
        local_78 = local_60;
        local_7c = local_60;
        local_80 = local_84;
        local_6c = local_84;
        (**(code **)(**(long **)(in_RDI + 0x96) + 0x1a0))
                  (*(long **)(in_RDI + 0x96),&local_10,local_60,local_60,local_84,local_84,local_40)
        ;
      }
      else {
        local_88 = (*(code *)**(undefined8 **)in_RDI)(in_RDI,1);
        local_98 = (*(code *)**(undefined8 **)in_RDI)(in_RDI,2);
        local_9c = local_88;
        local_94 = local_98;
        local_90 = local_98;
        local_8c = local_98;
        (**(code **)(**(long **)(in_RDI + 0x96) + 0x1a0))
                  (*(long **)(in_RDI + 0x96),&local_10,local_98,local_98,local_98,local_88,local_40)
        ;
      }
    }
    else {
      *in_stack_00000008 = CONCAT44(iStack_c,local_10);
      in_stack_00000008[1] = CONCAT44(iStack_4,local_8);
    }
    local_10 = (int)*(undefined8 *)local_38;
    iStack_c = (int)((ulong)*(undefined8 *)local_38 >> 0x20);
    local_8 = (int)*(undefined8 *)(local_38 + 2);
    iStack_4 = (int)((ulong)*(undefined8 *)(local_38 + 2) >> 0x20);
    local_10 = local_10 + 2;
    iVar2 = iStack_c + 2;
    local_8 = local_8 + -2;
    iStack_c = iVar2;
    iVar3 = (**(code **)(*(long *)in_RDI + 0x10))(in_RDI,2);
    iStack_4 = iVar2 + iVar3 + 2;
    if ((local_29 & 1) != 0) {
      if (in_stack_00000008 == (undefined8 *)0x0) {
        if (in_RDI[0x99].color == 2) {
          uVar4 = video::SColor::getAlpha(&local_14);
          video::SColor::SColor(&local_a4,uVar4,0xff,0xff,0xff);
          local_b4 = (u32)video::SColor::getInterpolated(in_RDI,in_stack_ffffffffffffff20,d);
          local_a8 = local_14.color;
          local_ac = local_14.color;
          local_b0 = local_b4;
          local_a0 = local_b4;
          (**(code **)(**(long **)(in_RDI + 0x96) + 0x1a0))
                    (*(long **)(in_RDI + 0x96),&local_10,local_14.color,local_14.color,local_b4,
                     local_b4,local_40);
        }
        else {
          uVar4 = video::SColor::getAlpha(&local_14);
          video::SColor::SColor(&local_bc,uVar4,0,0,0);
          local_b8 = (u32)video::SColor::getInterpolated(in_RDI,in_stack_ffffffffffffff20,d);
          (**(code **)(**(long **)(in_RDI + 0x96) + 0x1a0))
                    (*(long **)(in_RDI + 0x96),&local_10,local_14.color,local_b8,local_14.color,
                     local_b8,local_40);
        }
      }
      else {
        *(int *)((long)in_stack_00000008 + 4) = iStack_4;
      }
    }
  }
  rVar1.UpperLeftCorner.Y = iStack_c;
  rVar1.UpperLeftCorner.X = local_10;
  rVar1.LowerRightCorner.X = local_8;
  rVar1.LowerRightCorner.Y = iStack_4;
  return rVar1;
}

Assistant:

core::rect<s32> CGUISkin::draw3DWindowBackground(IGUIElement *element,
		bool drawTitleBar, video::SColor titleBarColor,
		const core::rect<s32> &r,
		const core::rect<s32> *clip,
		core::rect<s32> *checkClientArea)
{
	if (!Driver) {
		if (checkClientArea) {
			*checkClientArea = r;
		}
		return r;
	}

	core::rect<s32> rect = r;

	// top border
	rect.LowerRightCorner.Y = rect.UpperLeftCorner.Y + 1;
	if (!checkClientArea) {
		Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), rect, clip);
	}

	// left border
	rect.LowerRightCorner.Y = r.LowerRightCorner.Y;
	rect.LowerRightCorner.X = rect.UpperLeftCorner.X + 1;
	if (!checkClientArea) {
		Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), rect, clip);
	}

	// right border dark outer line
	rect.UpperLeftCorner.X = r.LowerRightCorner.X - 1;
	rect.LowerRightCorner.X = r.LowerRightCorner.X;
	rect.UpperLeftCorner.Y = r.UpperLeftCorner.Y;
	rect.LowerRightCorner.Y = r.LowerRightCorner.Y;
	if (!checkClientArea) {
		Driver->draw2DRectangle(getColor(EGDC_3D_DARK_SHADOW), rect, clip);
	}

	// right border bright innner line
	rect.UpperLeftCorner.X -= 1;
	rect.LowerRightCorner.X -= 1;
	rect.UpperLeftCorner.Y += 1;
	rect.LowerRightCorner.Y -= 1;
	if (!checkClientArea) {
		Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), rect, clip);
	}

	// bottom border dark outer line
	rect.UpperLeftCorner.X = r.UpperLeftCorner.X;
	rect.UpperLeftCorner.Y = r.LowerRightCorner.Y - 1;
	rect.LowerRightCorner.Y = r.LowerRightCorner.Y;
	rect.LowerRightCorner.X = r.LowerRightCorner.X;
	if (!checkClientArea) {
		Driver->draw2DRectangle(getColor(EGDC_3D_DARK_SHADOW), rect, clip);
	}

	// bottom border bright inner line
	rect.UpperLeftCorner.X += 1;
	rect.LowerRightCorner.X -= 1;
	rect.UpperLeftCorner.Y -= 1;
	rect.LowerRightCorner.Y -= 1;
	if (!checkClientArea) {
		Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), rect, clip);
	}

	// client area for background
	rect = r;
	rect.UpperLeftCorner.X += 1;
	rect.UpperLeftCorner.Y += 1;
	rect.LowerRightCorner.X -= 2;
	rect.LowerRightCorner.Y -= 2;
	if (checkClientArea) {
		*checkClientArea = rect;
	}

	if (!checkClientArea) {
		if (!UseGradient) {
			Driver->draw2DRectangle(getColor(EGDC_3D_FACE), rect, clip);
		} else if (Type == EGST_BURNING_SKIN) {
			const video::SColor c1 = getColor(EGDC_WINDOW).getInterpolated(0xFFFFFFFF, 0.9f);
			const video::SColor c2 = getColor(EGDC_WINDOW).getInterpolated(0xFFFFFFFF, 0.8f);

			Driver->draw2DRectangle(rect, c1, c1, c2, c2, clip);
		} else {
			const video::SColor c2 = getColor(EGDC_3D_SHADOW);
			const video::SColor c1 = getColor(EGDC_3D_FACE);
			Driver->draw2DRectangle(rect, c1, c1, c1, c2, clip);
		}
	}

	// title bar
	rect = r;
	rect.UpperLeftCorner.X += 2;
	rect.UpperLeftCorner.Y += 2;
	rect.LowerRightCorner.X -= 2;
	rect.LowerRightCorner.Y = rect.UpperLeftCorner.Y + getSize(EGDS_WINDOW_BUTTON_WIDTH) + 2;

	if (drawTitleBar) {
		if (checkClientArea) {
			(*checkClientArea).UpperLeftCorner.Y = rect.LowerRightCorner.Y;
		} else {
			// draw title bar
			// if (!UseGradient)
			//	Driver->draw2DRectangle(titleBarColor, rect, clip);
			// else
			if (Type == EGST_BURNING_SKIN) {
				const video::SColor c = titleBarColor.getInterpolated(video::SColor(titleBarColor.getAlpha(), 255, 255, 255), 0.8f);
				Driver->draw2DRectangle(rect, titleBarColor, titleBarColor, c, c, clip);
			} else {
				const video::SColor c = titleBarColor.getInterpolated(video::SColor(titleBarColor.getAlpha(), 0, 0, 0), 0.2f);
				Driver->draw2DRectangle(rect, titleBarColor, c, titleBarColor, c, clip);
			}
		}
	}

	return rect;
}